

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# understandLayerFactory.cpp
# Opt level: O0

void understandLayerFactory(void)

{
  ostream *poVar1;
  __shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  value_type local_1b0;
  value_type local_1a0;
  value_type local_190;
  value_type local_180;
  undefined1 local_170 [8];
  vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> types_;
  undefined1 local_150 [8];
  ShoesParameter p4;
  undefined1 local_100 [8];
  ShoesParameter p3;
  undefined1 local_b0 [8];
  ShoesParameter p2;
  allocator local_51;
  undefined1 local_50 [8];
  ShoesParameter p1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"red",&local_51);
  p2._66_1_ = 1;
  p1._24_4_ = 0x2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&p1.size,"Nike",(allocator *)&p2.field_0x43);
  p2._66_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)&p2.field_0x43);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"yellow",(allocator *)&p3.field_0x47);
  p3._69_1_ = 1;
  p2._24_4_ = 0x2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&p2.size,"Nike",(allocator *)&p3.field_0x46);
  p3._69_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)&p3.field_0x46);
  std::allocator<char>::~allocator((allocator<char> *)&p3.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_100,"red",(allocator *)&p4.field_0x47);
  p4._69_1_ = 1;
  p3._24_4_ = 0x2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&p3.size,"Adidas",(allocator *)&p4.field_0x46);
  p4._69_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)&p4.field_0x46);
  std::allocator<char>::~allocator((allocator<char> *)&p4.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_150,"red",
             (allocator *)
             ((long)&types_.
                     super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  types_.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  p4._24_4_ = 0x2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&p4.size,"Tmp",
             (allocator *)
             ((long)&types_.
                     super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  types_.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&types_.
                     super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&types_.
                     super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::vector
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170);
  ProductRegistry::CreateLayer((ProductRegistry *)&local_180,(ShoesParameter *)local_50);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::push_back
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170,
             &local_180);
  std::shared_ptr<Shoes>::~shared_ptr(&local_180);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  p_Var2 = (__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::operator[]
                     ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)
                      local_170,0);
  peVar3 = std::__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var2);
  (*peVar3->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProductRegistry::CreateLayer((ProductRegistry *)&local_190,(ShoesParameter *)local_b0);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::push_back
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170,
             &local_190);
  std::shared_ptr<Shoes>::~shared_ptr(&local_190);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  p_Var2 = (__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::operator[]
                     ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)
                      local_170,1);
  peVar3 = std::__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var2);
  (*peVar3->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProductRegistry::CreateLayer((ProductRegistry *)&local_1a0,(ShoesParameter *)local_100);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::push_back
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170,
             &local_1a0);
  std::shared_ptr<Shoes>::~shared_ptr(&local_1a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  p_Var2 = (__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::operator[]
                     ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)
                      local_170,2);
  peVar3 = std::__shared_ptr_access<Shoes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var2);
  (*peVar3->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProductRegistry::CreateLayer((ProductRegistry *)&local_1b0,(ShoesParameter *)local_150);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::push_back
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170,
             &local_1b0);
  std::shared_ptr<Shoes>::~shared_ptr(&local_1b0);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::~vector
            ((vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> *)local_170);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_150);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_100);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_b0);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_50);
  return;
}

Assistant:

void understandLayerFactory()
{
    // 构造
    ShoesParameter p1 = {"red", 42, "Nike"};
    ShoesParameter p2 = {"yellow", 42, "Nike"};
    ShoesParameter p3 = {"red", 42, "Adidas"};
    ShoesParameter p4 = {"red", 42, "Tmp"};

    vector<shared_ptr<Shoes>> types_;

    types_.push_back(ProductRegistry::CreateLayer(p1));
    cout<<"==========================="<<endl;
    types_[0]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p2));
    cout<<"==========================="<<endl;
    types_[1]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p3));
    cout<<"==========================="<<endl;
    types_[2]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p4));

}